

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestExtensionRangeSerialize::ByteSizeLong(TestExtensionRangeSerialize *this)

{
  uint uVar1;
  int32_t iVar2;
  uint32_t *puVar3;
  size_t sVar4;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestExtensionRangeSerialize *this_;
  TestExtensionRangeSerialize *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = google::protobuf::internal::ExtensionSet::ByteSize
                        (&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      iVar2 = _internal_foo_one(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      iVar2 = _internal_foo_two(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      iVar2 = _internal_foo_three(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      iVar2 = _internal_foo_four(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t TestExtensionRangeSerialize::ByteSizeLong() const {
  const TestExtensionRangeSerialize& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestExtensionRangeSerialize)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // int32 foo_one = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo_one());
    }
    // int32 foo_two = 6;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo_two());
    }
    // int32 foo_three = 7;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo_three());
    }
    // int32 foo_four = 13;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo_four());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}